

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,int x1,int y1,int z1,int c1,
          uchar val,float opacity)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  int y;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  byte *__s;
  uint uVar24;
  ulong uVar25;
  
  if (this->_data != (uchar *)0x0) {
    uVar18 = this->_width;
    uVar8 = (ulong)uVar18;
    if (uVar18 != 0) {
      uVar1 = this->_height;
      if (uVar1 != 0) {
        uVar2 = this->_depth;
        if ((uVar2 != 0) && (this->_spectrum != 0)) {
          uVar10 = (ulong)(uint)x1;
          if (x0 < x1) {
            uVar10 = (ulong)(uint)x0;
          }
          lVar22 = (long)x1;
          if (x1 < x0) {
            x1 = x0;
          }
          uVar9 = (ulong)(uint)y1;
          if (y0 < y1) {
            uVar9 = (ulong)(uint)y0;
          }
          uVar13 = y1;
          if (y1 < y0) {
            uVar13 = y0;
          }
          uVar19 = (ulong)(uint)z1;
          if (z0 < z1) {
            uVar19 = (ulong)(uint)z0;
          }
          uVar3 = z1;
          if (z1 < z0) {
            uVar3 = z0;
          }
          uVar25 = (ulong)(uint)c1;
          if (c0 < c1) {
            uVar25 = (ulong)(uint)c0;
          }
          uVar24 = c1;
          if (c1 < c0) {
            uVar24 = c0;
          }
          lVar22 = x0 - lVar22;
          lVar23 = -lVar22;
          if (0 < lVar22) {
            lVar23 = lVar22;
          }
          uVar12 = (uint)uVar10;
          iVar21 = ~x1 + uVar18;
          if (x1 < (int)uVar18) {
            iVar21 = 0;
          }
          lVar16 = (long)y0 - (long)y1;
          lVar22 = -lVar16;
          if (0 < lVar16) {
            lVar22 = lVar16;
          }
          iVar15 = ~uVar13 + uVar1;
          if ((int)uVar13 < (int)uVar1) {
            iVar15 = 0;
          }
          lVar17 = (long)z0 - (long)z1;
          lVar16 = -lVar17;
          if (0 < lVar17) {
            lVar16 = lVar17;
          }
          iVar14 = ~uVar3 + uVar2;
          if ((int)uVar3 < (int)uVar2) {
            iVar14 = 0;
          }
          lVar11 = (long)c0 - (long)c1;
          lVar17 = -lVar11;
          if (0 < lVar11) {
            lVar17 = lVar11;
          }
          iVar21 = iVar21 + 1 + ((int)uVar12 >> 0x1f & uVar12) + (int)lVar23;
          iVar4 = ~uVar24 + this->_spectrum;
          if ((int)uVar24 < (int)this->_spectrum) {
            iVar4 = 0;
          }
          if (0 < iVar21) {
            uVar18 = (uint)uVar9;
            iVar15 = iVar15 + ((int)uVar18 >> 0x1f & uVar18) + (int)lVar22 + 1;
            if (0 < iVar15) {
              uVar13 = (uint)uVar19;
              iVar14 = iVar14 + ((int)uVar13 >> 0x1f & uVar13) + (int)lVar16 + 1;
              if (0 < iVar14) {
                uVar3 = (uint)uVar25;
                iVar4 = iVar4 + ((int)uVar3 >> 0x1f & uVar3) + (int)lVar17 + 1;
                if (0 < iVar4) {
                  lVar22 = uVar1 * uVar8;
                  if ((int)uVar12 < 1) {
                    uVar10 = 0;
                  }
                  if ((int)uVar18 < 1) {
                    uVar9 = 0;
                  }
                  if ((int)uVar13 < 1) {
                    uVar19 = 0;
                  }
                  iVar7 = 0;
                  if ((int)uVar3 < 1) {
                    uVar25 = 0;
                  }
                  __s = this->_data +
                        lVar22 * (ulong)uVar2 * uVar25 + uVar19 * lVar22 + uVar9 * uVar8 + uVar10;
                  do {
                    iVar6 = 0;
                    do {
                      iVar20 = 0;
                      do {
                        iVar5 = iVar21;
                        if (1.0 <= opacity) {
                          memset(__s,(uint)val,(long)iVar21);
                          __s = __s + this->_width;
                        }
                        else {
                          do {
                            *__s = (byte)(int)((float)*__s *
                                               (1.0 - (float)(-(uint)(0.0 <= opacity) &
                                                             (uint)opacity)) +
                                              (float)val * ABS(opacity));
                            __s = __s + 1;
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                          __s = __s + (uVar8 - (long)iVar21);
                        }
                        iVar20 = iVar20 + 1;
                      } while (iVar20 != iVar15);
                      __s = __s + (uVar1 - iVar15) * uVar8;
                      iVar6 = iVar6 + 1;
                    } while (iVar6 != iVar14);
                    __s = __s + (ulong)(uVar2 - iVar14) * lVar22;
                    iVar7 = iVar7 + 1;
                  } while (iVar7 != iVar4);
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0, const int c0,
                            const int x1, const int y1, const int z1, const int c1,
                            const T val, const float opacity=1) {
      if (is_empty()) return *this;
      const bool bx = (x0<x1), by = (y0<y1), bz = (z0<z1), bc = (c0<c1);
      const int
        nx0 = bx?x0:x1, nx1 = bx?x1:x0,
        ny0 = by?y0:y1, ny1 = by?y1:y0,
        nz0 = bz?z0:z1, nz1 = bz?z1:z0,
        nc0 = bc?c0:c1, nc1 = bc?c1:c0;
      const int
        lX = (1 + nx1 - nx0) + (nx1>=width()?width() - 1 - nx1:0) + (nx0<0?nx0:0),
        lY = (1 + ny1 - ny0) + (ny1>=height()?height() - 1 - ny1:0) + (ny0<0?ny0:0),
        lZ = (1 + nz1 - nz0) + (nz1>=depth()?depth() - 1 - nz1:0) + (nz0<0?nz0:0),
        lC = (1 + nc1 - nc0) + (nc1>=spectrum()?spectrum() - 1 - nc1:0) + (nc0<0?nc0:0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        offY = (unsigned long)_width*(_height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      T *ptrd = data(nx0<0?0:nx0,ny0<0?0:ny0,nz0<0?0:nz0,nc0<0?0:nc0);
      if (lX>0 && lY>0 && lZ>0 && lC>0)
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              if (opacity>=1) {
                if (sizeof(T)!=1) { for (int x = 0; x<lX; ++x) *(ptrd++) = val; ptrd+=offX; }
                else { std::memset(ptrd,(int)val,lX); ptrd+=_width; }
              } else { for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*val + *ptrd*copacity); ++ptrd; } ptrd+=offX; }
            }
            ptrd+=offY;
          }
          ptrd+=offZ;
        }
      return *this;
    }